

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_sentinel_task(void *arg1,void *arg2)

{
  void *p_thr;
  void *thrd;
  void *arg2_local;
  void *arg1_local;
  
  if (fio_data->active != '\0') {
    fio_state_callback_force(FIO_CALL_BEFORE_FORK);
    fio_lock(&fio_fork_lock);
    p_thr = fio_thread_new(fio_sentinel_worker_thread,&fio_fork_lock);
    fio_thread_free(p_thr);
    fio_lock(&fio_fork_lock);
    fio_unlock(&fio_fork_lock);
    fio_state_callback_force(FIO_CALL_AFTER_FORK);
    fio_state_callback_force(FIO_CALL_IN_MASTER);
  }
  return;
}

Assistant:

static void fio_sentinel_task(void *arg1, void *arg2) {
  if (!fio_data->active)
    return;
  fio_state_callback_force(FIO_CALL_BEFORE_FORK);
  fio_lock(&fio_fork_lock); /* will wait for worker thread to release lock. */
  void *thrd =
      fio_thread_new(fio_sentinel_worker_thread, (void *)&fio_fork_lock);
  fio_thread_free(thrd);
  fio_lock(&fio_fork_lock);   /* will wait for worker thread to release lock. */
  fio_unlock(&fio_fork_lock); /* release lock for next fork. */
  fio_state_callback_force(FIO_CALL_AFTER_FORK);
  fio_state_callback_force(FIO_CALL_IN_MASTER);
  (void)arg1;
  (void)arg2;
}